

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

bool Rml::BuildToken(String *token,char **token_begin,char *string_end,bool first_token,
                    bool collapse_white_space,bool break_at_endline,
                    TextTransform text_transformation,bool decode_escape_characters)

{
  code *pcVar1;
  bool bVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  char cVar8;
  String escape_code;
  long *local_50 [2];
  long local_40 [2];
  
  if ((*token_begin == string_end) &&
     (bVar4 = Assert("RMLUI_ASSERT(token_begin != string_end)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1fd), !bVar4)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::reserve((ulong)token);
  pbVar6 = (byte *)*token_begin;
  if ((0x20 < (ulong)*pbVar6) || (bVar4 = true, (0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))
  {
    bVar4 = false;
  }
  do {
    if (pbVar6 == (byte *)string_end) {
      return false;
    }
    bVar7 = *pbVar6;
    cVar8 = (char)token;
    pbVar3 = pbVar6;
    if (bVar7 == 0x26 && decode_escape_characters) {
      while (pbVar3 != (byte *)string_end) {
        if (*pbVar3 == 0x3b) {
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar6 + 1);
          iVar5 = ::std::__cxx11::string::compare((char *)local_50);
          if (iVar5 == 0) {
            bVar7 = 0x3c;
LAB_002312d8:
            bVar2 = false;
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)local_50);
            if (iVar5 == 0) {
              bVar7 = 0x3e;
              goto LAB_002312d8;
            }
            iVar5 = ::std::__cxx11::string::compare((char *)local_50);
            bVar7 = 0x26;
            if (iVar5 == 0) goto LAB_002312d8;
            iVar5 = ::std::__cxx11::string::compare((char *)local_50);
            if (iVar5 == 0) {
              bVar7 = 0x22;
              goto LAB_002312d8;
            }
            iVar5 = ::std::__cxx11::string::compare((char *)local_50);
            if (iVar5 != 0) {
              *token_begin = (char *)pbVar6;
              goto LAB_002312d8;
            }
            bVar2 = true;
            bVar7 = 0x20;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          if (!bVar2) goto LAB_002311dd;
          goto LAB_0023117c;
        }
        *token_begin = (char *)(pbVar3 + 1);
        pbVar3 = pbVar3 + 1;
      }
      *token_begin = (char *)pbVar6;
LAB_0023117c:
      if (bVar4) {
        if (!collapse_white_space) {
LAB_00231380:
          *token_begin = (char *)pbVar6;
          return false;
        }
        if (!first_token) {
          ::std::__cxx11::string::push_back(cVar8);
        }
        bVar4 = false;
      }
LAB_00231221:
      ::std::__cxx11::string::push_back(cVar8);
    }
    else {
      if (bVar7 == 10 && break_at_endline) {
        ::std::__cxx11::string::push_back(cVar8);
        *token_begin = *token_begin + 1;
        return true;
      }
LAB_002311dd:
      if ((0x20 < bVar7) || ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0)) goto LAB_0023117c;
      if (!bVar4) {
        if (collapse_white_space) {
          pbVar6 = (byte *)*token_begin;
          if (pbVar6 == (byte *)string_end) {
            return false;
          }
          do {
            bVar7 = *pbVar6;
            if (0x20 < (ulong)bVar7) {
              return false;
            }
            if ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0) {
              return false;
            }
            if (bVar7 == 10 && break_at_endline) {
              return false;
            }
            pbVar6 = pbVar6 + 1;
          } while (pbVar6 != (byte *)string_end);
          ::std::__cxx11::string::push_back(cVar8);
          return false;
        }
        goto LAB_00231380;
      }
      if (!collapse_white_space) goto LAB_00231221;
    }
    pbVar6 = (byte *)(*token_begin + 1);
    *token_begin = (char *)pbVar6;
  } while( true );
}

Assistant:

static bool BuildToken(String& token, const char*& token_begin, const char* string_end, bool first_token, bool collapse_white_space,
	bool break_at_endline, Style::TextTransform text_transformation, bool decode_escape_characters)
{
	RMLUI_ASSERT(token_begin != string_end);

	token.reserve(string_end - token_begin + token.size());

	// Check what the first character of the token is; all we need to know is if it is white-space or not.
	bool parsing_white_space = StringUtilities::IsWhitespace(*token_begin);

	// Loop through the string from the token's beginning until we find an end to the token. This can occur in various
	// places, depending on the white-space processing;
	//  - at the end of a section of non-white-space characters,
	//  - at the end of a section of white-space characters, if we're not collapsing white-space,
	//  - at an endline token, if we're breaking on endlines.
	while (token_begin != string_end)
	{
		bool force_non_whitespace = false;
		char character = *token_begin;

		const char* escape_begin = token_begin;

		// Check for an ampersand; if we find one, we've got an HTML escaped character.
		if (decode_escape_characters && character == '&')
		{
			// Find the terminating ';'.
			while (token_begin != string_end && *token_begin != ';')
				++token_begin;

			// If we couldn't find the ';', print the token like normal text.
			if (token_begin == string_end)
			{
				token_begin = escape_begin;
			}
			// We could find a ';', parse the escape code. If the escape code is recognised, set the parsed character
			// to the appropriate one. If it is a non-breaking space, prevent it being picked up as whitespace. If it
			// is not recognised, print the token like normal text.
			else
			{
				String escape_code(escape_begin + 1, token_begin);

				if (escape_code == "lt")
					character = '<';
				else if (escape_code == "gt")
					character = '>';
				else if (escape_code == "amp")
					character = '&';
				else if (escape_code == "quot")
					character = '"';
				else if (escape_code == "nbsp")
				{
					character = ' ';
					force_non_whitespace = true;
				}
				else
					token_begin = escape_begin;
			}
		}

		// Check for an endline token; if we're breaking on endlines and we find one, then return true to indicate a
		// forced break.
		if (break_at_endline && character == '\n')
		{
			token += '\n';
			token_begin++;
			return true;
		}

		// If we've transitioned from white-space characters to non-white-space characters, or vice-versa, then check
		// if should terminate the token; if we're not collapsing white-space, then yes (as sections of white-space are
		// non-breaking), otherwise only if we've transitioned from characters to white-space.
		bool white_space = !force_non_whitespace && StringUtilities::IsWhitespace(character);
		if (white_space != parsing_white_space)
		{
			if (!collapse_white_space)
			{
				// Restore pointer to the beginning of the escaped token, if we processed an escape code.
				token_begin = escape_begin;
				return false;
			}

			// We're collapsing white-space; we only tokenise words, not white-space, so we're only done tokenising
			// once we've begun parsing non-white-space and then found white-space.
			if (!parsing_white_space)
			{
				// However, if we are the last non-whitespace character in the string, and there are trailing
				// whitespace characters after this token, then we need to append a single space to the end of this
				// token.
				if (token_begin != string_end && LastToken(token_begin, string_end, collapse_white_space, break_at_endline))
					token += ' ';

				return false;
			}

			// We've transitioned from white-space to non-white-space, so we append a single white-space character.
			if (!first_token)
				token += ' ';

			parsing_white_space = false;
		}

		// If the current character is white-space, we'll append a space character to the token if we're not collapsing
		// sections of white-space.
		if (white_space)
		{
			if (!collapse_white_space)
				token += ' ';
		}
		else
		{
			if (text_transformation == Style::TextTransform::Uppercase)
			{
				if (character >= 'a' && character <= 'z')
					character += ('A' - 'a');
			}
			else if (text_transformation == Style::TextTransform::Lowercase)
			{
				if (character >= 'A' && character <= 'Z')
					character -= ('A' - 'a');
			}

			token += character;
		}

		++token_begin;
	}

	return false;
}